

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureStructTest::getShaderBody
          (XFBCaptureStructTest *this,GLuint test_case_index,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  char *pcVar1;
  TestError *this_00;
  char *__s;
  bool bVar2;
  
  __s = ::glcts::fixed_sample_locations_values + 1;
  std::__cxx11::string::_M_replace
            ((ulong)out_calculations,0,(char *)out_calculations->_M_string_length,0x1af8059);
  switch(stage) {
  case VERTEX:
    bVar2 = test_case_index == 0;
    break;
  case TESS_CTRL:
    goto switchD_008ae56d_caseD_2;
  case TESS_EVAL:
    bVar2 = test_case_index == 1;
    break;
  case GEOMETRY:
    bVar2 = test_case_index == 2;
    break;
  case FRAGMENT:
    __s = "    fs_out = goku.goten + goku.gohan + goku.chichi;\n";
    goto switchD_008ae56d_caseD_2;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x69a9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  __s = ::glcts::fixed_sample_locations_values + 1;
  if (bVar2) {
    __s = "    goku.chichi = uni_chichi;\n    goku.gohan  = uni_gohan;\n";
  }
switchD_008ae56d_caseD_2:
  pcVar1 = (char *)out_assignments->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)out_assignments,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

void XFBCaptureStructTest::getShaderBody(GLuint test_case_index, Utils::Shader::STAGES stage,
										 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	static const GLchar* vs_tes_gs = "    goku.chichi = uni_chichi;\n"
									 "    goku.gohan  = uni_gohan;\n";
	static const GLchar* fs = "    fs_out = goku.goten + goku.gohan + goku.chichi;\n";

	const GLchar* assignments = "";

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;

	case Utils::Shader::GEOMETRY:
		if (TEST_GS == test_case_index)
		{
			assignments = vs_tes_gs;
		}
		break;

	case Utils::Shader::TESS_CTRL:
		break;

	case Utils::Shader::TESS_EVAL:
		if (TEST_TES == test_case_index)
		{
			assignments = vs_tes_gs;
		}
		break;

	case Utils::Shader::VERTEX:
		if (TEST_VS == test_case_index)
		{
			assignments = vs_tes_gs;
		}
		break;

	default:
		TCU_FAIL("Invalid enum");
	}

	out_assignments = assignments;
}